

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.hpp
# Opt level: O0

void qclab::dense::kron<qclab::dense::SquareMatrix<float>>
               (SquareMatrix<float> *A,SquareMatrix<float> *B,SquareMatrix<float> *kronAB)

{
  float fVar1;
  float fVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  float *pfVar8;
  long local_60;
  int64_t l;
  int64_t j;
  int64_t k;
  int64_t i;
  int64_t colsB;
  int64_t rowsB;
  int64_t colsA;
  int64_t rowsA;
  SquareMatrix<float> *kronAB_local;
  SquareMatrix<float> *B_local;
  SquareMatrix<float> *A_local;
  
  iVar3 = SquareMatrix<float>::rows(A);
  iVar4 = SquareMatrix<float>::cols(A);
  iVar5 = SquareMatrix<float>::rows(B);
  iVar6 = SquareMatrix<float>::cols(B);
  iVar7 = SquareMatrix<float>::rows(kronAB);
  if (iVar7 != iVar3 * iVar5) {
    __assert_fail("kronAB.rows() == rowsA * rowsB",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/kron.hpp"
                  ,0x12,
                  "void qclab::dense::kron(const T &, const T &, T &) [T = qclab::dense::SquareMatrix<float>]"
                 );
  }
  iVar7 = SquareMatrix<float>::cols(kronAB);
  if (iVar7 == iVar4 * iVar6) {
    for (k = 0; k < iVar3; k = k + 1) {
      for (j = 0; j < iVar5; j = j + 1) {
        for (l = 0; l < iVar4; l = l + 1) {
          for (local_60 = 0; local_60 < iVar6; local_60 = local_60 + 1) {
            pfVar8 = SquareMatrix<float>::operator()(A,k,l);
            fVar1 = *pfVar8;
            pfVar8 = SquareMatrix<float>::operator()(B,j,local_60);
            fVar2 = *pfVar8;
            pfVar8 = SquareMatrix<float>::operator()(kronAB,k * iVar5 + j,l * iVar6 + local_60);
            *pfVar8 = fVar1 * fVar2;
          }
        }
      }
    }
    return;
  }
  __assert_fail("kronAB.cols() == colsA * colsB",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/kron.hpp"
                ,0x13,
                "void qclab::dense::kron(const T &, const T &, T &) [T = qclab::dense::SquareMatrix<float>]"
               );
}

Assistant:

void kron( const T& A , const T& B , T& kronAB ) {
      const int64_t rowsA = A.rows() ;
      const int64_t colsA = A.cols() ;
      const int64_t rowsB = B.rows() ;
      const int64_t colsB = B.cols() ;
      assert( kronAB.rows() == rowsA * rowsB ) ;
      assert( kronAB.cols() == colsA * colsB ) ;
      #pragma omp parallel for
      for ( int64_t i = 0; i < rowsA; i++ ) {        // i loops over rows of A
        for ( int64_t k = 0; k < rowsB; k++ ) {      // k loops over rows of B
          for ( int64_t j = 0; j < colsA; j++ ) {    // j loops over cols of A
            for ( int64_t l = 0; l < colsB; l++ ) {  // l loops over cols of B
              kronAB( i*rowsB + k , j*colsB + l ) = A(i,j) * B(k,l) ;
            }
          }
        }
      }
    }